

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O0

void net_update(net_t *n)

{
  layer *plVar1;
  int iVar2;
  int local_74;
  int j_1;
  branch_layer_t *me_1;
  int j;
  branch_layer_t *me;
  _func_void_data_t_ptr_double *update [7];
  int local_14;
  int i;
  net_t *n_local;
  
  memcpy(&me,&DAT_0010acd0,0x38);
  if (update[(ulong)n->method - 1] == (_func_void_data_t_ptr_double *)0x0) {
    if (n->method == TRAIN_ADAM) {
      for (local_14 = 0; local_14 < n->size; local_14 = local_14 + 1) {
        iVar2 = is_branch_layer(n->layer[local_14]);
        if (iVar2 == 0) {
          data_update_adam(&n->layer[local_14]->weight,(double)n->rate,n->t);
          plVar1 = n->layer[local_14];
          iVar2 = n->t;
          n->t = iVar2 + 1;
          data_update_adam(&plVar1->bias,(double)n->rate,iVar2);
        }
        else {
          plVar1 = n->layer[local_14];
          for (local_74 = 0; local_74 < *(int *)&plVar1[1].func; local_74 = local_74 + 1) {
            *(float *)(*(long *)(plVar1[1].in.val + (long)local_74 * 4 + 2) + 0x1c) = n->rate;
            net_update(*(net_t **)(plVar1[1].in.val + (long)local_74 * 4 + 2));
          }
        }
      }
    }
  }
  else {
    for (local_14 = 0; local_14 < n->size; local_14 = local_14 + 1) {
      iVar2 = is_branch_layer(n->layer[local_14]);
      if (iVar2 == 0) {
        (*update[(ulong)n->method - 1])(&n->layer[local_14]->weight,(double)n->rate);
        (*update[(ulong)n->method - 1])(&n->layer[local_14]->bias,(double)n->rate);
      }
      else {
        plVar1 = n->layer[local_14];
        for (me_1._4_4_ = 0; me_1._4_4_ < *(int *)&plVar1[1].func; me_1._4_4_ = me_1._4_4_ + 1) {
          *(float *)(*(long *)(plVar1[1].in.val + (long)me_1._4_4_ * 4 + 2) + 0x1c) = n->rate;
          net_update(*(net_t **)(plVar1[1].in.val + (long)me_1._4_4_ * 4 + 2));
        }
      }
    }
  }
  return;
}

Assistant:

void net_update(net_t *n)
{
	int i = 0;
	void (*update[TRAIN_MAX])(data_t *, double) = {
		NULL,
		data_update_sgd,
		data_update_momentum,
		data_update_momentum,
		data_update_adagrad,
		data_update_adadelta,
		NULL};

	if (update[n->method])
		for (i = 0; i < n->size; ++i)
		{
			if (!is_branch_layer(n->layer[i]))
			{
				update[n->method](&n->layer[i]->weight, n->rate);
				update[n->method](&n->layer[i]->bias, n->rate);
			} else {
				branch_layer_t *me = (branch_layer_t *)n->layer[i];
				for (int j = 0; j < me->num; ++j)
				{
					me->branch[j].n->rate = n->rate;
					net_update(me->branch[j].n);
				}
			}
		}
	else if (n->method == TRAIN_ADAM)
		for (i = 0; i < n->size; ++i)
		{
			if (!is_branch_layer(n->layer[i]))
			{
				data_update_adam(&n->layer[i]->weight, n->rate, n->t);
				data_update_adam(&n->layer[i]->bias, n->rate, n->t++);
			} else {
				branch_layer_t *me = (branch_layer_t *)n->layer[i];
				for (int j = 0; j < me->num; ++j)
				{
					me->branch[j].n->rate = n->rate;
					net_update(me->branch[j].n);
				}
			}
		}
}